

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O0

bool __thiscall raptor::Client::Connect(Client *this,char *addr,size_t timeout_ms)

{
  bool bVar1;
  Status *pSVar2;
  undefined8 uVar3;
  undefined8 in_R9;
  Status local_60;
  undefined1 local_30 [8];
  raptor_error e;
  size_t timeout_ms_local;
  char *addr_local;
  Client *this_local;
  
  e._value = (Status *)timeout_ms;
  TcpClient::Connect((TcpClient *)local_30,(char *)this->_impl,(size_t)addr);
  bVar1 = RefCountedPtr<raptor::Status>::operator!=
                    ((RefCountedPtr<raptor::Status> *)local_30,(nullptr_t)0x0);
  if (bVar1) {
    pSVar2 = RefCountedPtr<raptor::Status>::operator->((RefCountedPtr<raptor::Status> *)local_30);
    Status::ToString_abi_cxx11_(&local_60);
    uVar3 = std::__cxx11::string::c_str();
    LogFormatPrint("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/surface/client.cc"
                   ,0x36,kLogLevelError,"client: connect (%s)",uVar3,in_R9,pSVar2);
    std::__cxx11::string::~string((string *)&local_60);
  }
  this_local._7_1_ = !bVar1;
  RefCountedPtr<raptor::Status>::~RefCountedPtr((RefCountedPtr<raptor::Status> *)local_30);
  return this_local._7_1_;
}

Assistant:

bool Client::Connect(const char* addr, size_t timeout_ms) {
    raptor_error e = _impl->Connect(addr, timeout_ms);
    if (e != RAPTOR_ERROR_NONE) {
        log_error("client: connect (%s)", e->ToString().c_str());
        return false;
    }
    return true;
}